

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O3

GLenum Diligent::TexFormatToGLInternalTexFormat(TEXTURE_FORMAT TexFormat,Uint32 BindFlags)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  string msg;
  string local_30;
  
  if (TexFormatToGLInternalTexFormat(Diligent::TEXTURE_FORMAT,unsigned_int)::FormatMap == '\0') {
    TexFormatToGLInternalTexFormat();
  }
  if (TexFormat < TEX_FORMAT_NUM_FORMATS) {
    uVar1 = TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[TexFormat];
    if (BindFlags != 0) {
      uVar2 = 0x8cac;
      if (uVar1 != 0x822e) {
        uVar2 = uVar1;
      }
      uVar3 = 0x81a5;
      if (uVar2 != 0x822a) {
        uVar3 = uVar2;
      }
      if ((BindFlags & 0x40) != 0) {
        uVar1 = uVar3;
      }
    }
  }
  else {
    FormatString<char[17],int,char[31],int,char[2]>
              (&local_30,(Diligent *)"Texture format (",(char (*) [17])&stack0xffffffffffffffcc,
               (int *)") is out of allowed range [0, ",(char (*) [31])&stack0xffffffffffffffc8,
               (int *)0x8aeb7d,(char (*) [2])(ulong)CONCAT24(TexFormat,0x69));
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"TexFormatToGLInternalTexFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLTypeConversions.cpp"
               ,0xcd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

GLenum TexFormatToGLInternalTexFormat(TEXTURE_FORMAT TexFormat, Uint32 BindFlags)
{
    static const FormatToGLInternalTexFormatMap FormatMap;
    if (TexFormat >= TEX_FORMAT_UNKNOWN && TexFormat < TEX_FORMAT_NUM_FORMATS)
    {
        auto GLFormat = FormatMap[TexFormat];
        if (BindFlags != 0)
            GLFormat = CorrectGLTexFormat(GLFormat, BindFlags);
        return GLFormat;
    }
    else
    {
        UNEXPECTED("Texture format (", int{TexFormat}, ") is out of allowed range [0, ", int{TEX_FORMAT_NUM_FORMATS} - 1, "]");
        return 0;
    }
}